

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O3

void av1_update_layer_context_change_config(AV1_COMP *cpi,int64_t target_bandwidth)

{
  int iVar1;
  int iVar2;
  AV1_PRIMARY *pAVar3;
  LAYER_CONTEXT *pLVar4;
  int64_t iVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int8_t *piVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  int local_54;
  float local_50;
  
  iVar8 = (cpi->svc).number_spatial_layers;
  if (0 < iVar8) {
    iVar1 = (cpi->common).mi_params.mi_cols;
    iVar2 = (cpi->common).mi_params.mi_rows;
    pAVar3 = cpi->ppi;
    uVar7 = (cpi->svc).number_temporal_layers;
    local_50 = 1.0;
    local_54 = 0;
    do {
      if (0 < (int)uVar7) {
        pLVar4 = (cpi->svc).layer_context;
        uVar12 = (ulong)(uVar7 * local_54);
        lVar13 = (uVar12 << 0x20) + -0x100000000;
        lVar15 = 0;
        do {
          lVar13 = lVar13 + 0x100000000;
          *(undefined8 *)((long)&pLVar4[uVar12].target_bandwidth + lVar15) =
               *(undefined8 *)((long)&pLVar4[uVar12].layer_target_bitrate + lVar15);
          lVar15 = lVar15 + 0x3380;
        } while ((ulong)uVar7 * 0x3380 - lVar15 != 0);
        if (0 < (int)uVar7) {
          iVar5 = pLVar4[lVar13 >> 0x20].target_bandwidth;
          lVar13 = 0;
          do {
            pLVar4 = (cpi->svc).layer_context;
            lVar9 = (int)(uVar7 * local_54) + lVar13;
            pLVar4[lVar9].spatial_layer_target_bandwidth = iVar5;
            lVar15 = pLVar4[lVar9].target_bandwidth;
            if (target_bandwidth != 0) {
              local_50 = (float)lVar15 / (float)target_bandwidth;
            }
            pLVar4[lVar9].p_rc.starting_buffer_level =
                 (long)((float)(pAVar3->p_rc).starting_buffer_level * local_50);
            pLVar4[lVar9].p_rc.optimal_buffer_level =
                 (long)((float)(pAVar3->p_rc).optimal_buffer_level * local_50);
            lVar11 = (long)((float)(pAVar3->p_rc).maximum_buffer_size * local_50);
            pLVar4[lVar9].p_rc.maximum_buffer_size = lVar11;
            lVar6 = pLVar4[lVar9].p_rc.buffer_level;
            lVar14 = pLVar4[lVar9].p_rc.bits_off_target;
            if (lVar11 <= lVar14) {
              lVar14 = lVar11;
            }
            pLVar4[lVar9].p_rc.bits_off_target = lVar14;
            if (lVar6 < lVar11) {
              lVar11 = lVar6;
            }
            pLVar4[lVar9].p_rc.buffer_level = lVar11;
            dVar16 = cpi->framerate / (double)pLVar4[lVar9].framerate_factor;
            pLVar4[lVar9].framerate = dVar16;
            dVar16 = round((double)lVar15 / dVar16);
            pLVar4[lVar9].rc.avg_frame_bandwidth = (int)dVar16;
            pLVar4[lVar9].rc.max_frame_bandwidth = (cpi->rc).max_frame_bandwidth;
            pLVar4[lVar9].rc.rtc_external_ratectrl = (cpi->rc).rtc_external_ratectrl;
            iVar8 = av1_quantizer_to_qindex(pLVar4[lVar9].max_q);
            pLVar4[lVar9].rc.worst_quality = iVar8;
            iVar8 = av1_quantizer_to_qindex(pLVar4[lVar9].min_q);
            pLVar4[lVar9].rc.best_quality = iVar8;
            if ((cpi->rc).use_external_qp_one_pass != 0) {
              iVar8 = (cpi->rc).best_quality;
              pLVar4[lVar9].rc.worst_quality = (cpi->rc).worst_quality;
              pLVar4[lVar9].rc.best_quality = iVar8;
            }
            iVar8 = (cpi->svc).number_spatial_layers;
            if (((int)lVar13 == 0 && 1 < iVar8) &&
               ((pLVar4[lVar9].map == (int8_t *)0x0 ||
                ((cpi->svc).prev_number_spatial_layers != iVar8)))) {
              pLVar4[lVar9].sb_index = 0;
              pLVar4[lVar9].actual_num_seg1_blocks = 0;
              pLVar4[lVar9].actual_num_seg2_blocks = 0;
              pLVar4[lVar9].counter_encode_maxq_scene_change = 0;
              aom_free(pLVar4[lVar9].map);
              piVar10 = (int8_t *)aom_calloc((long)iVar2 * (long)iVar1,1);
              pLVar4[lVar9].map = piVar10;
              if (piVar10 == (int8_t *)0x0) {
                aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                   "Failed to allocate lc->map");
              }
            }
            uVar7 = (cpi->svc).number_temporal_layers;
            lVar13 = lVar13 + 1;
          } while ((int)lVar13 < (int)uVar7);
          iVar8 = (cpi->svc).number_spatial_layers;
        }
      }
      local_54 = local_54 + 1;
    } while (local_54 < iVar8);
  }
  return;
}

Assistant:

void av1_update_layer_context_change_config(AV1_COMP *const cpi,
                                            const int64_t target_bandwidth) {
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  AV1_COMMON *const cm = &cpi->common;
  SVC *const svc = &cpi->svc;
  int layer = 0;
  int64_t spatial_layer_target = 0;
  float bitrate_alloc = 1.0;
  const int mi_rows = cm->mi_params.mi_rows;
  const int mi_cols = cm->mi_params.mi_cols;
  for (int sl = 0; sl < svc->number_spatial_layers; ++sl) {
    for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
      layer = LAYER_IDS_TO_IDX(sl, tl, svc->number_temporal_layers);
      LAYER_CONTEXT *const lc = &svc->layer_context[layer];
      svc->layer_context[layer].target_bandwidth = lc->layer_target_bitrate;
    }
    spatial_layer_target = svc->layer_context[layer].target_bandwidth;
    for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
      LAYER_CONTEXT *const lc =
          &svc->layer_context[sl * svc->number_temporal_layers + tl];
      RATE_CONTROL *const lrc = &lc->rc;
      PRIMARY_RATE_CONTROL *const lp_rc = &lc->p_rc;
      lc->spatial_layer_target_bandwidth = spatial_layer_target;
      if (target_bandwidth != 0) {
        bitrate_alloc = (float)lc->target_bandwidth / target_bandwidth;
      }
      lp_rc->starting_buffer_level =
          (int64_t)(p_rc->starting_buffer_level * bitrate_alloc);
      lp_rc->optimal_buffer_level =
          (int64_t)(p_rc->optimal_buffer_level * bitrate_alloc);
      lp_rc->maximum_buffer_size =
          (int64_t)(p_rc->maximum_buffer_size * bitrate_alloc);
      lp_rc->bits_off_target =
          AOMMIN(lp_rc->bits_off_target, lp_rc->maximum_buffer_size);
      lp_rc->buffer_level =
          AOMMIN(lp_rc->buffer_level, lp_rc->maximum_buffer_size);
      lc->framerate = cpi->framerate / lc->framerate_factor;
      lrc->avg_frame_bandwidth =
          (int)round(lc->target_bandwidth / lc->framerate);
      lrc->max_frame_bandwidth = rc->max_frame_bandwidth;
      lrc->rtc_external_ratectrl = rc->rtc_external_ratectrl;
      lrc->worst_quality = av1_quantizer_to_qindex(lc->max_q);
      lrc->best_quality = av1_quantizer_to_qindex(lc->min_q);
      if (rc->use_external_qp_one_pass) {
        lrc->worst_quality = rc->worst_quality;
        lrc->best_quality = rc->best_quality;
      }
      // Reset the cyclic refresh parameters, if needed (map is NULL),
      // or number of spatial layers has changed.
      // Cyclic refresh is only applied on base temporal layer.
      if (svc->number_spatial_layers > 1 && tl == 0 &&
          (lc->map == NULL ||
           svc->prev_number_spatial_layers != svc->number_spatial_layers)) {
        lc->sb_index = 0;
        lc->actual_num_seg1_blocks = 0;
        lc->actual_num_seg2_blocks = 0;
        lc->counter_encode_maxq_scene_change = 0;
        aom_free(lc->map);
        CHECK_MEM_ERROR(cm, lc->map,
                        aom_calloc(mi_rows * mi_cols, sizeof(*lc->map)));
      }
    }
  }
}